

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

void __thiscall
llb_buildsystem_command_interface_spawn::ForwardingProcessDelegate::processHadError(llbuild::basic::
ProcessContext*,llbuild::basic::ProcessHandle,llvm::Twine_const__
          (void *this,ProcessContext *ctx,ProcessHandle handle,Twine *message)

{
  undefined8 local_58;
  llb_data_t err;
  string errStr;
  Twine *message_local;
  ProcessContext *ctx_local;
  ForwardingProcessDelegate *this_local;
  ProcessHandle handle_local;
  
  if (*(long *)((long)this + 8) != 0) {
    llvm::Twine::str_abi_cxx11_((string *)&err.data,message);
    local_58 = std::__cxx11::string::size();
    err.length = std::__cxx11::string::data();
    (**(code **)(*(long *)((long)this + 8) + 0x10))(**(undefined8 **)((long)this + 8),&local_58);
    std::__cxx11::string::~string((string *)&err.data);
  }
  return;
}

Assistant:

virtual void processHadError(ProcessContext* ctx, ProcessHandle handle,
                                 const Twine& message) {
      if (delegate != NULL) {
        auto errStr = message.str();
        llb_data_t err{ errStr.size(), (const uint8_t*) errStr.data() };
        delegate->process_had_error(delegate->context, &err);
      }
    }